

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)

{
  SmallBuffer *this;
  int64_t val;
  SmallBuffer *ptr;
  long *in_stack_00000160;
  DataType in_stack_0000016c;
  data_view *in_stack_00000170;
  HelicsDataBuffer in_stack_ffffffffffffffa8;
  SmallBuffer *in_stack_ffffffffffffffb8;
  data_view *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_8;
  
  this = getBuffer(in_stack_ffffffffffffffa8);
  if (this == (SmallBuffer *)0x0) {
    local_8 = helics::invalidValue<long>();
  }
  else {
    helics::data_view::data_view(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    helics::SmallBuffer::data(this);
    helics::detail::detectType((byte *)in_stack_ffffffffffffffb8);
    helics::valueExtract<long>(in_stack_00000170,in_stack_0000016c,in_stack_00000160);
    helics::data_view::~data_view((data_view *)0x1f3f0b);
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

int64_t helicsDataBufferToInteger(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return helics::invalidValue<int64_t>();
    }
    int64_t val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return val;
}